

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall
CServerBrowser::Set(CServerBrowser *this,NETADDR *Addr,int SetType,int Token,CServerInfo *pInfo)

{
  long lVar1;
  int iVar2;
  CServerEntry *pCVar3;
  int64 iVar4;
  int64 iVar5;
  int in_ECX;
  int in_EDX;
  CServerBrowser *in_RDI;
  int Type;
  CServerEntry *pEntry;
  CServerInfo *in_stack_ffffffffffffffb8;
  CServerEntry *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd4;
  CServerEntry *local_28;
  
  local_28 = (CServerEntry *)0x0;
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (in_EDX == 1) {
    if ((in_RDI->m_RefreshFlags & 1U) == 0) {
      return;
    }
    in_RDI->m_MasterRefreshTime = 0;
    pCVar3 = Find(in_RDI,iVar2,(NETADDR *)in_stack_ffffffffffffffb8);
    if (pCVar3 == (CServerEntry *)0x0) {
      local_28 = Add((CServerBrowser *)CONCAT44(in_stack_ffffffffffffffd4,in_EDX),
                     (int)((ulong)in_RDI >> 0x20),&in_stack_ffffffffffffffc0->m_Addr);
      QueueRequest(in_RDI,local_28);
    }
  }
  else if (in_EDX == 2) {
    if ((in_RDI->m_RefreshFlags & 1U) == 0) {
      return;
    }
    pCVar3 = Find(in_RDI,iVar2,(NETADDR *)in_stack_ffffffffffffffb8);
    if (pCVar3 == (CServerEntry *)0x0) {
      local_28 = Add((CServerBrowser *)CONCAT44(in_stack_ffffffffffffffd4,in_EDX),
                     (int)((ulong)in_RDI >> 0x20),&in_stack_ffffffffffffffc0->m_Addr);
      QueueRequest(in_RDI,local_28);
    }
  }
  else if (in_EDX == 3) {
    if ((in_RDI->m_RefreshFlags & 1U) != 0) {
      in_stack_ffffffffffffffd4 = 0;
      local_28 = Find(in_RDI,iVar2,(NETADDR *)in_stack_ffffffffffffffb8);
      if ((local_28 != (CServerEntry *)0x0) &&
         ((local_28->m_InfoState != 1 || (in_ECX != local_28->m_CurrentToken)))) {
        local_28 = (CServerEntry *)0x0;
      }
    }
    if ((local_28 == (CServerEntry *)0x0) && ((in_RDI->m_RefreshFlags & 2U) != 0)) {
      in_stack_ffffffffffffffb8 = (CServerInfo *)in_RDI->m_BroadcastTime;
      iVar4 = time_freq();
      in_stack_ffffffffffffffc0 =
           (CServerEntry *)((in_stack_ffffffffffffffb8->m_NetAddr).ip + iVar4 + -8);
      iVar4 = time_get();
      if (iVar4 <= (long)in_stack_ffffffffffffffc0) {
        in_stack_ffffffffffffffd4 = 1;
        local_28 = Add((CServerBrowser *)CONCAT44(1,in_EDX),(int)((ulong)in_RDI >> 0x20),
                       &in_stack_ffffffffffffffc0->m_Addr);
      }
    }
    if (local_28 != (CServerEntry *)0x0) {
      SetInfo((CServerBrowser *)CONCAT44(in_stack_ffffffffffffffd4,in_EDX),
              (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (in_stack_ffffffffffffffd4 == 1) {
        iVar4 = time_get();
        lVar1 = in_RDI->m_BroadcastTime;
        iVar5 = time_freq();
        iVar2 = minimum<int>((int)(((iVar4 - lVar1) * 1000) / iVar5),999);
        (local_28->m_Info).m_Latency = iVar2;
      }
      else {
        iVar4 = time_get();
        lVar1 = local_28->m_RequestTime;
        iVar5 = time_freq();
        iVar2 = minimum<int>((int)(((iVar4 - lVar1) * 1000) / iVar5),999);
        (local_28->m_Info).m_Latency = iVar2;
      }
      in_RDI->m_InfoUpdated = true;
      RemoveRequest(in_RDI,local_28);
    }
  }
  if (local_28 != (CServerEntry *)0x0) {
    CServerBrowserFilter::Sort
              ((CServerBrowserFilter *)CONCAT44(in_stack_ffffffffffffffd4,in_EDX),
               (CServerEntry **)in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (int)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void CServerBrowser::Set(const NETADDR &Addr, int SetType, int Token, const CServerInfo *pInfo)
{
	CServerEntry *pEntry = 0;
	switch(SetType)
	{
	case SET_MASTER_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			m_MasterRefreshTime = 0;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_FAV_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_TOKEN:
		{
			int Type;

			// internet entry
			if(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
			{
				Type = IServerBrowser::TYPE_INTERNET;
				pEntry = Find(Type, Addr);
				if(pEntry && (pEntry->m_InfoState != CServerEntry::STATE_PENDING || Token != pEntry->m_CurrentToken))
					pEntry = 0;
			}

			// lan entry
			if(!pEntry && (m_RefreshFlags&IServerBrowser::REFRESHFLAG_LAN) && m_BroadcastTime+time_freq() >= time_get())
			{
				Type = IServerBrowser::TYPE_LAN;
				pEntry = Add(Type, Addr);
			}

			// set info
			if(pEntry)
			{
				SetInfo(Type, pEntry, *pInfo);
				if(Type == IServerBrowser::TYPE_LAN)
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-m_BroadcastTime)*1000/time_freq()), 999);
				else
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-pEntry->m_RequestTime)*1000/time_freq()), 999);
				m_InfoUpdated = true;
				RemoveRequest(pEntry);
			}
		}
	}

	if(pEntry)
		m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FORCE);
}